

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartHelper.h
# Opt level: O1

int Imf_2_5::
    SplitChannels<__gnu_cxx::__normal_iterator<Imf_2_5::MultiViewChannelName*,std::vector<Imf_2_5::MultiViewChannelName,std::allocator<Imf_2_5::MultiViewChannelName>>>>
              (__normal_iterator<Imf_2_5::MultiViewChannelName_*,_std::vector<Imf_2_5::MultiViewChannelName,_std::allocator<Imf_2_5::MultiViewChannelName>_>_>
               *begin,__normal_iterator<Imf_2_5::MultiViewChannelName_*,_std::vector<Imf_2_5::MultiViewChannelName,_std::allocator<Imf_2_5::MultiViewChannelName>_>_>
                      *end,bool multipart,string *heroView)

{
  _Base_ptr __n;
  size_t __n_00;
  pointer pcVar1;
  undefined1 *puVar2;
  int iVar3;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this;
  const_iterator cVar4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  long *plVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  undefined7 in_register_00000011;
  int iVar11;
  undefined8 uVar12;
  _Base_ptr *pp_Var13;
  _Self __tmp;
  string *psVar14;
  string *psVar15;
  MultiViewChannelName *pMVar16;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
  layerToPart;
  string lname;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  viewsInLayers;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  _Self __tmp_1;
  _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
  local_148;
  __normal_iterator<Imf_2_5::MultiViewChannelName_*,_std::vector<Imf_2_5::MultiViewChannelName,_std::allocator<Imf_2_5::MultiViewChannelName>_>_>
  *local_118;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  string local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_b0;
  string local_80;
  _Base_ptr *local_60 [2];
  _Base_ptr local_50 [2];
  __normal_iterator<Imf_2_5::MultiViewChannelName_*,_std::vector<Imf_2_5::MultiViewChannelName,_std::allocator<Imf_2_5::MultiViewChannelName>_>_>
  *local_40;
  _Rb_tree_node_base *local_38;
  
  local_118 = end;
  if ((int)CONCAT71(in_register_00000011,multipart) == 0) {
    iVar11 = 1;
    if (end->_M_current != begin->_M_current) {
      psVar14 = &begin->_M_current->view;
      do {
        *(int *)(psVar14 + 1) = 0;
        iVar3 = std::__cxx11::string::compare((char *)psVar14);
        if (iVar3 == 0) {
          std::__cxx11::string::_M_assign((string *)((long)(psVar14 + 1) + 8));
        }
        else {
          MultiViewChannelName::getLayer_abi_cxx11_
                    (&local_110.first,(MultiViewChannelName *)((long)(psVar14 + -2) + 0x18));
          iVar3 = std::__cxx11::string::compare((char *)&local_110);
          if (iVar3 == 0) {
            __n_00 = psVar14->_M_string_length;
            if ((__n_00 == heroView->_M_string_length) &&
               ((__n_00 == 0 ||
                (iVar3 = bcmp((psVar14->_M_dataplus)._M_p,(heroView->_M_dataplus)._M_p,__n_00),
                iVar3 == 0)))) {
              std::__cxx11::string::_M_assign((string *)((long)(psVar14 + 1) + 8));
            }
            else {
              local_148._M_impl._0_8_ = &local_148._M_impl.super__Rb_tree_header._M_header._M_parent
              ;
              pcVar1 = (psVar14->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>((string *)&local_148,pcVar1,pcVar1 + __n_00)
              ;
              std::__cxx11::string::append((char *)&local_148);
              pp_Var13 = &local_b0._M_impl.super__Rb_tree_header._M_header._M_parent;
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_148,(ulong)psVar14[-1]._M_dataplus._M_p);
              plVar8 = puVar9 + 2;
              if ((_Base_ptr *)*puVar9 == (_Base_ptr *)plVar8) {
                local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar8;
                local_b0._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)puVar9[3];
                local_b0._M_impl._0_8_ = pp_Var13;
              }
              else {
                local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar8;
                local_b0._M_impl._0_8_ = (_Base_ptr *)*puVar9;
              }
              local_b0._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar9[1];
              *puVar9 = plVar8;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              std::__cxx11::string::operator=
                        ((string *)((long)(psVar14 + 1) + 8),(string *)&local_b0);
              if ((_Base_ptr *)local_b0._M_impl._0_8_ != pp_Var13) {
                operator_delete((void *)local_b0._M_impl._0_8_,
                                (ulong)((long)&(local_b0._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              p_Var7 = local_148._M_impl.super__Rb_tree_header._M_header._M_parent;
              pp_Var13 = (_Base_ptr *)local_148._M_impl._0_8_;
              if ((_Base_ptr *)local_148._M_impl._0_8_ !=
                  &local_148._M_impl.super__Rb_tree_header._M_header._M_parent) goto LAB_001842d6;
            }
          }
          else {
            local_60[0] = local_50;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_60,local_110.first._M_dataplus._M_p,
                       local_110.first._M_dataplus._M_p + local_110.first._M_string_length);
            std::__cxx11::string::append((char *)local_60);
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_60,(ulong)(psVar14->_M_dataplus)._M_p);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            psVar10 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_d0.field_2._M_allocated_capacity = *psVar10;
              local_d0.field_2._8_8_ = plVar8[3];
            }
            else {
              local_d0.field_2._M_allocated_capacity = *psVar10;
              local_d0._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_d0._M_string_length = plVar8[1];
            *plVar8 = (long)psVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
            local_148._M_impl._0_8_ = &local_148._M_impl.super__Rb_tree_header._M_header._M_parent;
            pp_Var13 = (_Base_ptr *)(plVar8 + 2);
            if ((_Base_ptr *)*plVar8 == pp_Var13) {
              local_148._M_impl.super__Rb_tree_header._M_header._M_parent = *pp_Var13;
              local_148._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar8[3];
            }
            else {
              local_148._M_impl.super__Rb_tree_header._M_header._M_parent = *pp_Var13;
              local_148._M_impl._0_8_ = (_Base_ptr *)*plVar8;
            }
            local_148._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar8[1];
            *plVar8 = (long)pp_Var13;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            MultiViewChannelName::getSuffix_abi_cxx11_
                      (&local_80,(MultiViewChannelName *)((long)(psVar14 + -2) + 0x18));
            pp_Var13 = &local_b0._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var7 = (_Base_ptr)0xf;
            if ((_Base_ptr *)local_148._M_impl._0_8_ !=
                &local_148._M_impl.super__Rb_tree_header._M_header._M_parent) {
              p_Var7 = local_148._M_impl.super__Rb_tree_header._M_header._M_parent;
            }
            if (p_Var7 < (_Base_ptr)
                         (local_80._M_string_length +
                         local_148._M_impl.super__Rb_tree_header._M_header._0_8_)) {
              uVar12 = (_Base_ptr)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                uVar12 = local_80.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar12 <
                  (_Base_ptr)
                  (local_80._M_string_length +
                  local_148._M_impl.super__Rb_tree_header._M_header._0_8_)) goto LAB_00184135;
              puVar9 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_80,0,(char *)0x0,local_148._M_impl._0_8_);
            }
            else {
LAB_00184135:
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_148,(ulong)local_80._M_dataplus._M_p);
            }
            plVar8 = puVar9 + 2;
            if ((_Base_ptr *)*puVar9 == (_Base_ptr *)plVar8) {
              local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar8;
              local_b0._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)puVar9[3];
              local_b0._M_impl._0_8_ = pp_Var13;
            }
            else {
              local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar8;
              local_b0._M_impl._0_8_ = (_Base_ptr *)*puVar9;
            }
            local_b0._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar9[1];
            *puVar9 = plVar8;
            puVar9[1] = 0;
            *(undefined1 *)plVar8 = 0;
            std::__cxx11::string::operator=((string *)((long)(psVar14 + 1) + 8),(string *)&local_b0)
            ;
            if ((_Base_ptr *)local_b0._M_impl._0_8_ != pp_Var13) {
              operator_delete((void *)local_b0._M_impl._0_8_,
                              (ulong)((long)&(local_b0._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,
                              (ulong)(local_80.field_2._M_allocated_capacity + 1));
            }
            if ((_Base_ptr *)local_148._M_impl._0_8_ !=
                &local_148._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)local_148._M_impl._0_8_,
                              (ulong)((long)&(local_148._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            p_Var7 = local_50[0];
            pp_Var13 = local_60[0];
            if (local_60[0] != local_50) {
LAB_001842d6:
              operator_delete(pp_Var13,(ulong)((long)&p_Var7->_M_color + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110.first._M_dataplus._M_p != &local_110.first.field_2) {
            operator_delete(local_110.first._M_dataplus._M_p,
                            local_110.first.field_2._M_allocated_capacity + 1);
          }
        }
        puVar2 = (undefined1 *)(psVar14 + 2);
        psVar14 = (string *)((long)(psVar14 + 3) + 0x10);
      } while ((MultiViewChannelName *)((long)puVar2 + 8) != local_118->_M_current);
    }
  }
  else {
    local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_b0._M_impl.super__Rb_tree_header._M_header;
    local_b0._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_b0._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    iVar11 = 0;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
    pMVar16 = begin->_M_current;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_40 = begin;
    if (end->_M_current != pMVar16) {
      do {
        MultiViewChannelName::getLayer_abi_cxx11_(&local_110.first,pMVar16);
        this = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                *)&local_b0,&local_110.first);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(this,&pMVar16->view);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.first._M_dataplus._M_p != &local_110.first.field_2) {
          operator_delete(local_110.first._M_dataplus._M_p,
                          local_110.first.field_2._M_allocated_capacity + 1);
        }
        pMVar16 = pMVar16 + 1;
      } while (pMVar16 != end->_M_current);
    }
    local_148._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_148._M_impl.super__Rb_tree_header._M_header;
    local_148._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_148._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    local_148._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_148._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_148._M_impl.super__Rb_tree_header._M_header._M_right =
         local_148._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_b0._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_b0._M_impl.super__Rb_tree_header) {
      iVar11 = 0;
      p_Var7 = local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(p_Var7 + 2),heroView);
        if (cVar4._M_node != (_Base_ptr)&p_Var7[2]._M_parent) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var7 + 1),heroView);
          pmVar5 = std::
                   map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                   ::operator[]((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                                 *)&local_148,&local_110);
          *pmVar5 = iVar11;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110.second._M_dataplus._M_p != &local_110.second.field_2) {
            operator_delete(local_110.second._M_dataplus._M_p,
                            local_110.second.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110.first._M_dataplus._M_p != &local_110.first.field_2) {
            operator_delete(local_110.first._M_dataplus._M_p,
                            local_110.first.field_2._M_allocated_capacity + 1);
          }
          iVar11 = iVar11 + 1;
        }
        local_38 = p_Var7;
        for (p_Var6 = p_Var7[2]._M_right; p_Var6 != (_Rb_tree_node_base *)&p_Var7[2]._M_parent;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          __n = p_Var6[1]._M_parent;
          if ((__n != (_Base_ptr)heroView->_M_string_length) ||
             ((__n != (_Base_ptr)0x0 &&
              (iVar3 = bcmp(*(void **)(p_Var6 + 1),(heroView->_M_dataplus)._M_p,(size_t)__n),
              iVar3 != 0)))) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (&local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var7 + 1),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var6 + 1));
            pmVar5 = std::
                     map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                     ::operator[]((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                                   *)&local_148,&local_110);
            *pmVar5 = iVar11;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110.second._M_dataplus._M_p != &local_110.second.field_2) {
              operator_delete(local_110.second._M_dataplus._M_p,
                              local_110.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110.first._M_dataplus._M_p != &local_110.first.field_2) {
              operator_delete(local_110.first._M_dataplus._M_p,
                              local_110.first.field_2._M_allocated_capacity + 1);
            }
            iVar11 = iVar11 + 1;
          }
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_38);
      } while ((_Rb_tree_header *)p_Var7 != &local_b0._M_impl.super__Rb_tree_header);
    }
    if (local_118->_M_current != local_40->_M_current) {
      psVar15 = (string *)&local_40->_M_current->internal_name;
      do {
        std::__cxx11::string::_M_assign(psVar15);
        MultiViewChannelName::getLayer_abi_cxx11_
                  (&local_d0,(MultiViewChannelName *)(psVar15 + -0x50));
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_110,&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (psVar15 + -0x28));
        pmVar5 = std::
                 map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                 ::operator[]((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                               *)&local_148,&local_110);
        *(mapped_type *)(psVar15 + -8) = *pmVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.second._M_dataplus._M_p != &local_110.second.field_2) {
          operator_delete(local_110.second._M_dataplus._M_p,
                          local_110.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.first._M_dataplus._M_p != &local_110.first.field_2) {
          operator_delete(local_110.first._M_dataplus._M_p,
                          local_110.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        pMVar16 = (MultiViewChannelName *)(psVar15 + 0x20);
        psVar15 = psVar15 + 0x70;
      } while (pMVar16 != local_118->_M_current);
    }
    std::
    _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
    ::~_Rb_tree(&local_148);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_b0);
  }
  return iVar11;
}

Assistant:

int 
SplitChannels(const T & begin,const T & end,bool multipart=true,const std::string & heroView="")
{
    if(!multipart)
    {
	for(T i=begin;i!=end;i++)
	{
	    i->part_number=0;
	
	    //does this have a view name set?
	    if(i->view=="")
	    {
		i->internal_name=i->name;
	    }else{
		
		std::string lname = i->getLayer();
	   
		// no layer, only non-hero views get view name in layer name
	
	    
		if(lname=="")
		{
		    if(i->view==heroView)
		    {
			i->internal_name = i->name;
		    }else{
			i->internal_name = i->view+"."+i->name;
		    }
		}else{
		    i->internal_name = lname+"."+i->view+"."+i->getSuffix();
		}
	    }
	}
	// single part created
	return 1;
    }else{
	// step 1: extract individual layers and parts
	// for each layer, enumerate which views are active
	
	std::map< std::string , std::set< std::string > > viewsInLayers;
	for(T i=begin;i!=end;i++)
	{
	    viewsInLayers[i->getLayer()].insert(i->view);
	}
	
	// step 2: assign a part number to each layer/view
	
	std::map< std::pair<std::string,std::string> , int > layerToPart;
	
	int partCount=0;
	
	for(std::map< std::string , std::set< std::string > >::const_iterator layer=viewsInLayers.begin();
	    layer!=viewsInLayers.end();layer++)
	{
	    // if this layer has a heroView, insert that first
	    bool layer_has_hero = layer->second.find(heroView)!=layer->second.end();
	    if( layer_has_hero )
	    {
		layerToPart[ std::make_pair(layer->first,heroView) ] = partCount++;
	    }
	    
	    
	    // insert other layers which aren't the hero view
	    for(std::set< std::string >::const_iterator view=layer->second.begin();
		view!=layer->second.end();view++)
	    {
		if(*view!=heroView)
		{
		    layerToPart[ std::make_pair(layer->first,*view) ] = partCount++;
		}
	    }
		
	}
	
	// step 3: update part number of each provided channel
	
	for( T i=begin;i!=end;i++)
	{
	    i->internal_name=i->name;
	    i->part_number = layerToPart[ std::make_pair(i->getLayer(),i->view) ];
	}
	
	
	// return number of parts created
	return partCount;
    }
}